

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

Value * __thiscall
wabt::Decompiler::DecompileExpr(Value *__return_storage_ptr__,Decompiler *this,Node *n,Node *parent)

{
  Value *this_00;
  char cVar1;
  ExprType EVar2;
  Opcode OVar3;
  Address AVar4;
  pointer pNVar5;
  long lVar6;
  AST *pAVar7;
  size_t sVar8;
  pointer pVVar9;
  const_iterator cVar10;
  Node *pNVar11;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view postfix;
  string_view postfix_00;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view prefix_02;
  Type TVar12;
  string *psVar13;
  mapped_type *pmVar14;
  OpcodeExpr<(wabt::ExprType)6> *pOVar15;
  OpcodeExpr<(wabt::ExprType)56> *pOVar16;
  VarExpr<(wabt::ExprType)23> *ve;
  IfExpr *pIVar17;
  size_t sVar18;
  size_t sVar19;
  VarExpr<(wabt::ExprType)8> *pVVar20;
  BrTableExpr *pBVar21;
  VarExpr<(wabt::ExprType)22> *ve_00;
  OpcodeExpr<(wabt::ExprType)14> *pOVar22;
  LoadStoreExpr<(wabt::ExprType)21> *pLVar23;
  VarExpr<(wabt::ExprType)9> *pVVar24;
  BlockExprBase<(wabt::ExprType)7> *pBVar25;
  ConstExpr *pCVar26;
  VarExpr<(wabt::ExprType)24> *ve_01;
  BlockExprBase<(wabt::ExprType)25> *pBVar27;
  VarExpr<(wabt::ExprType)19> *ve_02;
  VarExpr<(wabt::ExprType)18> *ve_03;
  LoadStoreExpr<(wabt::ExprType)44> *pLVar28;
  VarExpr<(wabt::ExprType)12> *pVVar29;
  VarExpr<(wabt::ExprType)38> *pVVar30;
  OpcodeExpr<(wabt::ExprType)53> *pOVar31;
  uint *args_1;
  char *pcVar32;
  _Alloc_hider _Var33;
  pointer pVVar34;
  Index i;
  uint uVar35;
  long lVar36;
  Node *c;
  pointer n_00;
  char (*in_R8) [4];
  pointer args_2;
  string_view *in_R9;
  Var *v;
  pointer this_01;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  size_t i_1;
  ulong uVar38;
  bool bVar39;
  string_view prefix_03;
  string_view y;
  string_view prefix_04;
  string_view infix;
  string_view first_indent;
  string_view infix_00;
  string_view sVar40;
  size_type sStackY_1a0;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 uVar41;
  Precedence PVar42;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  string decls;
  undefined1 local_168 [8];
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  string_view local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> args;
  char *jmp;
  size_type sStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  Value *local_f0;
  char *local_e8;
  undefined8 uStack_e0;
  char *local_d8;
  undefined8 uStack_d0;
  char *local_c8;
  undefined8 uStack_c0;
  char *local_b8;
  undefined8 uStack_b0;
  char *local_a8;
  undefined8 uStack_a0;
  char *local_98;
  undefined8 uStack_90;
  char *local_88;
  undefined8 uStack_80;
  char *local_78;
  undefined8 uStack_70;
  char *local_68;
  undefined8 uStack_60;
  pointer local_58;
  size_type sStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  size_type sVar37;
  
  args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar5 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  n_00 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
  local_160.container = &__return_storage_ptr__->v;
  for (; pVVar34 = args.
                   super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                   ._M_impl.super__Vector_impl_data._M_start,
      __result.container = local_160.container, n_00 != pNVar5; n_00 = n_00 + 1) {
    DecompileExpr((Value *)&decls,this,n_00,n);
    std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
    emplace_back<wabt::Decompiler::Value>(&args,(Value *)&decls);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&decls);
  }
  args_1 = &switchD_00164e49::switchdataD_0018d84c;
  switch(n->ntype) {
  case Uninitialized:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler.cc"
                  ,0x18a,"Value wabt::Decompiler::DecompileExpr(const Node &, const Node *)");
  case FlushToVars:
    std::__cxx11::string::string((string *)&decls,"let ",(allocator *)&local_158);
    for (uVar35 = 0; uVar35 < (n->u).field_0.var_count; uVar35 = uVar35 + 1) {
      if (uVar35 != 0) {
        std::__cxx11::string::append((char *)&decls);
      }
      TempVarName_abi_cxx11_((string *)&local_158,this,(n->u).field_0.var_start + uVar35);
      std::__cxx11::string::append((string *)&decls);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::append((char *)&decls);
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_160;
    prefix.size_ = decls._M_string_length;
    prefix.data_ = decls._M_dataplus._M_p;
    local_68 = "";
    uStack_60 = 0;
    WrapNAry((Value *)local_160.container,this,&args,prefix,(string_view)ZEXT816(0x18da77),Assign);
    goto LAB_001651aa;
  case FlushedVar:
    TempVarName_abi_cxx11_(&decls,this,(n->u).field_0.var_start);
    goto LAB_0016506a;
  case Statements:
    decls._M_dataplus._M_p = (pointer)0x0;
    decls._M_string_length = 0;
    decls.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_160.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&decls);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&decls);
    lVar36 = 8;
    for (uVar38 = 0;
        uVar38 < (ulong)(((long)(n->children).
                                super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(n->children).
                               super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0x30); uVar38 = uVar38 + 1) {
      lVar6 = *(long *)((long)&((args.
                                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->v).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar36);
      cVar1 = *(char *)(*(long *)(lVar6 + -0x20) + -1 + *(long *)(lVar6 + -0x18));
      if ((cVar1 != ':') && (cVar1 != '}')) {
        std::__cxx11::string::push_back((char)lVar6 + -0x20);
      }
      std::__copy_move<true,false,std::random_access_iterator_tag>::
      __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)args.
                         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar36 + -8),
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)&((args.
                            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            ._M_impl.super__Vector_impl_data._M_start)->v).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar36),__result);
      lVar36 = lVar36 + 0x20;
    }
    goto LAB_001651af;
  case EndReturn:
    local_78 = "";
    uStack_70 = 0;
LAB_00164f9a:
    pcVar32 = "return ";
    sStackY_1a0 = 7;
LAB_00164fac:
    prefix_03.size_ = sStackY_1a0;
    prefix_03.data_ = pcVar32;
    WrapNAry((Value *)local_160.container,this,&args,prefix_03,(string_view)ZEXT816(0x18da77),None);
    goto LAB_001651af;
  case Decl:
    pAVar7 = this->cur_ast;
    psVar13 = Var::name_abi_cxx11_((n->u).var);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&pAVar7->vars_defined,psVar13);
    pmVar14->defined = true;
    psVar13 = Var::name_abi_cxx11_((n->u).var);
    std::__cxx11::string::string((string *)&jmp,(string *)psVar13);
    TVar12 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl((string *)&local_158,this,(string *)&jmp,TVar12);
    std::operator+(&decls,"var ",(string *)&local_158);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,&decls
               ,local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__result.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    goto LAB_001651aa;
  case DeclInit:
    pAVar7 = this->cur_ast;
    psVar13 = Var::name_abi_cxx11_((n->u).var);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&pAVar7->vars_defined,psVar13);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (pmVar14->defined == true) {
      psVar13 = Var::name_abi_cxx11_((n->u).var);
      name.data_ = (psVar13->_M_dataplus)._M_p;
      name.size_ = psVar13->_M_string_length;
      local_158 = VarName(this,name);
      cat<wabt::string_view,char[4]>
                (&decls,(wabt *)&local_158,(string_view *)0x18da5b,(char (*) [4])args_1);
      prefix_00.size_ = decls._M_string_length;
      prefix_00.data_ = decls._M_dataplus._M_p;
      local_88 = "";
      uStack_80 = 0;
      WrapChild((Value *)__result.container,this,pVVar34,prefix_00,(string_view)ZEXT816(0x18da77),
                None);
    }
    else {
      psVar13 = Var::name_abi_cxx11_((n->u).var);
      std::__cxx11::string::string((string *)&jmp,(string *)psVar13);
      TVar12 = Func::GetLocalType(this->cur_func,(n->u).var);
      LocalDecl((string *)&local_158,this,(string *)&jmp,TVar12);
      cat<char[5],std::__cxx11::string,char[4]>
                (&decls,(wabt *)"var ",(char (*) [5])&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18da5b,in_R8
                );
      prefix_01.size_ = decls._M_string_length;
      prefix_01.data_ = decls._M_dataplus._M_p;
      local_98 = "";
      uStack_90 = 0;
      WrapChild((Value *)local_160.container,this,pVVar34,prefix_01,(string_view)ZEXT816(0x18da77),
                None);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      __result.container =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_160;
    }
LAB_001651aa:
    std::__cxx11::string::_M_dispose();
    goto LAB_001651af;
  }
  EVar2 = n->etype;
  switch(EVar2) {
  case Binary:
    pOVar15 = cast<wabt::OpcodeExpr<(wabt::ExprType)6>,wabt::Expr>(n->e);
    OpcodeToToken_abi_cxx11_(&decls,this,(Opcode)(pOVar15->opcode).enum_);
    bVar39 = std::operator==(&decls,"*");
    PVar42 = Multiply;
    if (((!bVar39) && (bVar39 = std::operator==(&decls,"/"), !bVar39)) &&
       (bVar39 = std::operator==(&decls,"%"), !bVar39)) {
      bVar39 = std::operator==(&decls,"+");
      PVar42 = Add;
      if ((!bVar39) && (bVar39 = std::operator==(&decls,"-"), !bVar39)) {
        bVar39 = std::operator==(&decls,"&");
        PVar42 = Bit;
        if ((!bVar39) &&
           ((bVar39 = std::operator==(&decls,"|"), !bVar39 &&
            (bVar39 = std::operator==(&decls,"^"), !bVar39)))) {
          bVar39 = std::operator==(&decls,"<<");
          if ((bVar39) || (bVar39 = std::operator==(&decls,">>"), bVar39)) {
            PVar42 = Shift;
            __result.container =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_160;
          }
          else {
            PVar42 = OtherBin;
            __result.container =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_160;
          }
        }
      }
    }
    cat<char[2],std::__cxx11::string,char[2]>
              ((string *)&local_158,(wabt *)0x18db9f,(char (*) [2])&decls,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18db9f,
               (char (*) [2])in_R8);
    _Var33._M_p = local_158.data_;
    sVar37 = local_158.size_;
    goto LAB_001660ca;
  case Block:
    pBVar25 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(n->e);
    name_04.data_ = (pBVar25->block).label._M_dataplus._M_p;
    name_04.size_ = (pBVar25->block).label._M_string_length;
    local_158 = VarName(this,name_04);
    cat<char[7],wabt::string_view,char[2]>
              (&decls,(wabt *)"label ",(char (*) [7])&local_158,(string_view *)":",
               (char (*) [2])&local_158);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pVVar34,&decls);
    std::__cxx11::string::_M_dispose();
    if (((((parent != (Node *)0x0) && (parent->ntype != Statements)) &&
         (EVar2 = parent->etype, EVar2 != Block)) && (EVar2 != Loop)) &&
       ((EVar2 != If ||
        ((parent->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
         super__Vector_impl_data._M_start == n)))) {
      IndentValue(this,pVVar34,this->indent_amount,(string_view)ZEXT816(0));
      cVar10._M_current =
           (pVVar34->v).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&decls,"{",(allocator *)&local_158);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&pVVar34->v,cVar10,&decls);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::string((string *)&decls,"}",(allocator *)&local_158);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pVVar34,&decls
                );
      std::__cxx11::string::_M_dispose();
    }
    pVVar34->precedence = Atomic;
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_160;
    goto LAB_00165d75;
  case Br:
    pVVar20 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(n->e);
    pcVar32 = "goto ";
    if ((n->u).field_0.var_start == 2) {
      pcVar32 = "continue ";
    }
    psVar13 = Var::name_abi_cxx11_(&pVVar20->var);
    name_00.data_ = (psVar13->_M_dataplus)._M_p;
    name_00.size_ = psVar13->_M_string_length;
    sVar40 = VarName(this,name_00);
    y.size_ = (size_type)in_R8;
    y.data_ = (char *)sVar40.size_;
    operator+[abi_cxx11_(&decls,(wabt *)pcVar32,sVar40.data_,y);
    local_158 = (string_view)ZEXT816(0);
    local_148._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
               &decls,local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__result.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_158);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_158);
    goto LAB_001651aa;
  case BrIf:
    pVVar24 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(n->e);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    jmp = "goto";
    if ((n->u).field_0.var_start == 2) {
      jmp = "continue";
    }
    psVar13 = Var::name_abi_cxx11_(&pVVar24->var);
    name_03.data_ = (psVar13->_M_dataplus)._M_p;
    name_03.size_ = psVar13->_M_string_length;
    local_158 = VarName(this,name_03);
    cat<char[3],char_const*,char[2],wabt::string_view>
              (&decls,(wabt *)") ",(char (*) [3])&jmp,(char **)0x18db9f,(char (*) [2])&local_158,
               in_R9);
    local_58 = decls._M_dataplus._M_p;
    sStack_50 = decls._M_string_length;
    uVar41 = SUB84(decls._M_dataplus._M_p,0);
    uVar43 = (undefined4)((ulong)decls._M_dataplus._M_p >> 0x20);
    uVar44 = (undefined4)decls._M_string_length;
    uVar45 = (undefined4)(decls._M_string_length >> 0x20);
    sVar37 = 4;
    PVar42 = None;
    _Var33._M_p = "if (";
    goto LAB_001658f1;
  default:
    decls._M_dataplus._M_p = (pointer)&decls.field_2;
    decls._M_string_length = 0;
    decls.field_2._M_allocated_capacity = decls.field_2._M_allocated_capacity & 0xffffffffffffff00;
    switch(EVar2) {
    case MemoryCopy:
      break;
    case DataDrop:
    case MemoryInit:
    case Nop:
    case RefFunc:
    case RefNull:
    case Rethrow:
    case Return:
switchD_00165b98_caseD_1b:
      GetExprTypeName(EVar2);
      break;
    case MemoryFill:
      break;
    case MemoryGrow:
      break;
    case MemorySize:
      break;
    case RefIsNull:
      break;
    case ReturnCall:
      pVVar30 = cast<wabt::VarExpr<(wabt::ExprType)38>,wabt::Expr>(n->e);
      psVar13 = Var::name_abi_cxx11_(&pVVar30->var);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158
                     ,"return_call ",psVar13);
      std::__cxx11::string::operator=((string *)&decls,(string *)&local_158);
      std::__cxx11::string::_M_dispose();
      PVar42 = None;
      goto LAB_00166004;
    case ReturnCallIndirect:
      break;
    case Select:
      break;
    default:
      if (EVar2 == Ternary) {
        pOVar31 = cast<wabt::OpcodeExpr<(wabt::ExprType)53>,wabt::Expr>(n->e);
LAB_0016606c:
        OpcodeToToken_abi_cxx11_((string *)&local_158,this,(Opcode)(pOVar31->opcode).enum_);
        std::__cxx11::string::operator=((string *)&decls,(string *)&local_158);
        std::__cxx11::string::_M_dispose();
      }
      else {
        if (EVar2 == CallIndirect) break;
        if (EVar2 == Convert) {
          pOVar31 = (OpcodeExpr<(wabt::ExprType)53> *)
                    cast<wabt::OpcodeExpr<(wabt::ExprType)16>,wabt::Expr>(n->e);
          goto LAB_0016606c;
        }
        if (EVar2 != Call) goto switchD_00165b98_caseD_1b;
        pVVar29 = cast<wabt::VarExpr<(wabt::ExprType)12>,wabt::Expr>(n->e);
        Var::name_abi_cxx11_(&pVVar29->var);
        std::__cxx11::string::_M_assign((string *)&decls);
      }
      goto LAB_00166001;
    }
    std::__cxx11::string::assign((char *)&decls);
LAB_00166001:
    PVar42 = Atomic;
LAB_00166004:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158,
                   &decls,"(");
    local_e8 = ")";
    uStack_e0 = 1;
    postfix_00.size_._0_4_ = 1;
    postfix_00.data_ = ")";
    postfix_00.size_._4_4_ = 0;
    WrapNAry((Value *)__result.container,this,&args,local_158,postfix_00,PVar42);
    goto LAB_001660e0;
  case BrTable:
    pBVar21 = cast<wabt::BrTableExpr,wabt::Expr>(n->e);
    std::__cxx11::string::string((string *)&decls,"br_table[",(allocator *)&local_158);
    pVVar9 = (pBVar21->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_01 = (pBVar21->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_01 != pVVar9;
        this_01 = this_01 + 1) {
      psVar13 = Var::name_abi_cxx11_(this_01);
      name_01.data_ = (psVar13->_M_dataplus)._M_p;
      name_01.size_ = psVar13->_M_string_length;
      sVar40 = VarName(this,name_01);
      std::__cxx11::string::append((char *)&decls,(ulong)sVar40.data_);
      std::__cxx11::string::append((char *)&decls);
    }
    std::__cxx11::string::append((char *)&decls);
    psVar13 = Var::name_abi_cxx11_(&pBVar21->default_target);
    name_02.data_ = (psVar13->_M_dataplus)._M_p;
    name_02.size_ = psVar13->_M_string_length;
    sVar40 = VarName(this,name_02);
    std::__cxx11::string::append((char *)&decls,(ulong)sVar40.data_);
    std::__cxx11::string::append((char *)&decls);
    local_d8 = ")";
    uStack_d0 = 1;
    uVar41 = 0x199e61;
    uVar43 = 0;
    uVar44 = 1;
    uVar45 = 0;
    PVar42 = Atomic;
    _Var33 = decls._M_dataplus;
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar37 = decls._M_string_length;
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_160;
LAB_001658f1:
    postfix.data_._4_4_ = uVar43;
    postfix.data_._0_4_ = uVar41;
    postfix.size_._0_4_ = uVar44;
    postfix.size_._4_4_ = uVar45;
    prefix_04.size_ = sVar37;
    prefix_04.data_ = _Var33._M_p;
    WrapChild((Value *)__result.container,this,pVVar34,prefix_04,postfix,PVar42);
    goto LAB_001651aa;
  case Compare:
    pOVar22 = cast<wabt::OpcodeExpr<(wabt::ExprType)14>,wabt::Expr>(n->e);
    OpcodeToToken_abi_cxx11_((string *)&local_158,this,(Opcode)(pOVar22->opcode).enum_);
    cat<char[2],std::__cxx11::string,char[2]>
              (&decls,(wabt *)0x18db9f,(char (*) [2])&local_158,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18db9f,
               (char (*) [2])in_R8);
    PVar42 = Equal;
    _Var33 = decls._M_dataplus;
    sVar37 = decls._M_string_length;
LAB_001660ca:
    infix_00.size_ = sVar37;
    infix_00.data_ = _Var33._M_p;
    WrapBinary((Value *)__result.container,this,&args,infix_00,false,PVar42);
    goto LAB_001660e0;
  case Const:
    pCVar26 = cast<wabt::ConstExpr,wabt::Expr>(n->e);
    switch((pCVar26->const_).type_.enum_) {
    case V128:
      pcVar32 = "V128";
      goto LAB_00165bad;
    case F64:
      to_string_abi_cxx11_(&decls,this,*(double *)(pCVar26->const_).data_.v);
      break;
    case F32:
      to_string_abi_cxx11_((string *)&local_158,this,(double)*(float *)(pCVar26->const_).data_.v);
      std::operator+(&decls,(string *)&local_158,"f");
      jmp = (char *)0x0;
      sStack_110 = 0;
      local_108._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&jmp,&decls,
                 local_168);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__result.container,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&jmp);
      *(undefined4 *)
       &__result.container[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 10;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&jmp);
      goto LAB_001660e0;
    case I64:
      std::__cxx11::to_string((string *)&local_158,*(long *)(pCVar26->const_).data_.v);
      std::operator+(&decls,(string *)&local_158,"L");
      jmp = (char *)0x0;
      sStack_110 = 0;
      local_108._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&jmp,&decls,
                 local_168);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__result.container,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&jmp);
      *(undefined4 *)
       &__result.container[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 10;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&jmp);
LAB_00165f4e:
      std::__cxx11::string::_M_dispose();
      goto LAB_001651aa;
    case I32:
      std::__cxx11::to_string(&decls,*(int *)(pCVar26->const_).data_.v);
      break;
    default:
      abort();
    }
    goto LAB_0016506a;
  case Drop:
    goto switchD_001651f1_caseD_11;
  case GlobalGet:
    ve_03 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(n->e);
    Get<(wabt::ExprType)18>((Value *)__result.container,this,ve_03);
    break;
  case GlobalSet:
    ve_02 = cast<wabt::VarExpr<(wabt::ExprType)19>,wabt::Expr>(n->e);
    Set<(wabt::ExprType)19>((Value *)__result.container,this,pVVar34,ve_02);
    break;
  case If:
    pIVar17 = cast<wabt::IfExpr,wabt::Expr>(n->e);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar8 = (pIVar17->false_).size_;
    local_f0 = args.
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
    bVar39 = true;
    if ((ulong)((long)((args.
                        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start)->v).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)((args.
                       super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start)->v).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      bVar39 = 0x20 < (ulong)((long)args.
                                    super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].v.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)args.
                                   super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].v.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    }
    this_00 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start + 2;
    sVar18 = Value::width(args.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    sVar19 = Value::width(local_f0);
    uVar38 = sVar19 + sVar18;
    if (sVar8 == 0) {
LAB_00165538:
      if ((!bVar39) && (uVar38 <= this->target_exp_width)) {
        args_2 = pVVar34[1].v.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        cat<char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[3]>
                  (&decls,(wabt *)"if (",
                   (char (*) [5])
                   (pVVar34->v).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") { ",
                   (char (*) [5])args_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" }",
                   (char (*) [3])CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if (sVar8 != 0) {
          cat<char[9],std::__cxx11::string,char[3]>
                    ((string *)&local_158,(wabt *)" else { ",
                     (char (*) [9])
                     (this_00->v).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" }",
                     (char (*) [3])args_2);
          std::__cxx11::string::append((string *)&decls);
          std::__cxx11::string::_M_dispose();
        }
        __result.container =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_160;
        local_158.size_ = decls._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decls._M_dataplus._M_p == &decls.field_2) {
          local_148._8_8_ = decls.field_2._8_8_;
          decls._M_dataplus._M_p = (pointer)&local_148;
        }
        local_148._M_allocated_capacity = decls.field_2._M_allocated_capacity;
        decls._M_string_length = 0;
        local_158.data_ = decls._M_dataplus._M_p;
        decls.field_2._M_allocated_capacity =
             decls.field_2._M_allocated_capacity & 0xffffffffffffff00;
        jmp = (char *)0x0;
        sStack_110 = 0;
        local_108._M_allocated_capacity = 0;
        decls._M_dataplus._M_p = (pointer)&decls.field_2;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&jmp,
                   (string *)&local_158);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__result.container,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&jmp);
        *(Precedence *)((long)__result.container + 0x18) = If;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&jmp);
        goto LAB_00165f4e;
      }
    }
    else {
      sVar18 = Value::width(this_00);
      if (!bVar39) {
        uVar38 = uVar38 + sVar18;
        bVar39 = 0x20 < (ulong)((long)pVVar34[2].v.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)pVVar34[2].v.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
        goto LAB_00165538;
      }
    }
    first_indent.size_ = 4;
    first_indent.data_ = "if (";
    IndentValue(this,pVVar34,4,first_indent);
    std::__cxx11::string::append
              ((char *)((pVVar34->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1));
    IndentValue(this,local_f0,this->indent_amount,(string_view)ZEXT816(0));
    std::__copy_move<true,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (pVVar34[1].v.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               pVVar34[1].v.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pVVar34);
    if (sVar8 != 0) {
      std::__cxx11::string::string((string *)&decls,"} else {",(allocator *)&local_158);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pVVar34,&decls
                );
      std::__cxx11::string::_M_dispose();
      IndentValue(this,this_00,this->indent_amount,(string_view)ZEXT816(0));
      std::__copy_move<true,false,std::random_access_iterator_tag>::
      __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (pVVar34[2].v.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 pVVar34[2].v.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pVVar34);
    }
    std::__cxx11::string::string((string *)&decls,"}",(allocator *)&local_158);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pVVar34,&decls);
    std::__cxx11::string::_M_dispose();
    pVVar34->precedence = If;
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_160;
    goto LAB_00165d75;
  case Load:
    pLVar23 = cast<wabt::LoadStoreExpr<(wabt::ExprType)21>,wabt::Expr>(n->e);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar11 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar35 = pLVar23->offset;
    OVar3.enum_ = (pLVar23->opcode).enum_;
    AVar4 = pLVar23->align;
    TVar12 = Opcode::GetResultType(&pLVar23->opcode);
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_160;
    LoadStore(this,pVVar34,pNVar11,(ulong)uVar35,OVar3,AVar4,TVar12);
    goto switchD_001651f1_caseD_11;
  case LocalGet:
    ve_00 = cast<wabt::VarExpr<(wabt::ExprType)22>,wabt::Expr>(n->e);
    Get<(wabt::ExprType)22>((Value *)__result.container,this,ve_00);
    break;
  case LocalSet:
    ve = cast<wabt::VarExpr<(wabt::ExprType)23>,wabt::Expr>(n->e);
    Set<(wabt::ExprType)23>((Value *)__result.container,this,pVVar34,ve);
    break;
  case LocalTee:
    ve_01 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(n->e);
    if (args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Get<(wabt::ExprType)24>((Value *)__result.container,this,ve_01);
    }
    else {
      Set<(wabt::ExprType)24>
                ((Value *)__result.container,this,
                 args.
                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start,ve_01);
    }
    break;
  case Loop:
    pBVar27 = cast<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Expr>(n->e);
    IndentValue(this,pVVar34,this->indent_amount,(string_view)ZEXT816(0));
    cVar10._M_current =
         (pVVar34->v).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    name_05.data_ = (pBVar27->block).label._M_dataplus._M_p;
    name_05.size_ = (pBVar27->block).label._M_string_length;
    local_158 = VarName(this,name_05);
    cat<char[6],wabt::string_view,char[3]>
              (&decls,(wabt *)"loop ",(char (*) [6])&local_158,(string_view *)0x18e4c6,
               (char (*) [3])&local_158);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&pVVar34->v,cVar10,&decls);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string((string *)&decls,"}",(allocator *)&local_158);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pVVar34,&decls);
    std::__cxx11::string::_M_dispose();
    pVVar34->precedence = Atomic;
LAB_00165d75:
    Value::Value((Value *)__result.container,pVVar34);
    break;
  case Nop:
    pcVar32 = "nop";
    goto LAB_00165bce;
  case RefNull:
    pcVar32 = "null";
LAB_00165bad:
    std::__cxx11::string::string((string *)&decls,pcVar32,(allocator *)&jmp);
LAB_0016506a:
    local_158 = (string_view)ZEXT816(0);
    local_148._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
               &decls,local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__result.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_158);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 10;
LAB_0016509e:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_158);
    goto LAB_001651aa;
  case Rethrow:
    local_c8 = "";
    uStack_c0 = 0;
    pcVar32 = "rethrow ";
    sStackY_1a0 = 8;
    goto LAB_00164fac;
  case Return:
    local_b8 = "";
    uStack_b0 = 0;
    goto LAB_00164f9a;
  case Store:
    pLVar28 = cast<wabt::LoadStoreExpr<(wabt::ExprType)44>,wabt::Expr>(n->e);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar11 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar35 = pLVar28->offset;
    OVar3.enum_ = (pLVar28->opcode).enum_;
    AVar4 = pLVar28->align;
    TVar12 = Opcode::GetParamType2(&pLVar28->opcode);
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_160;
    LoadStore(this,pVVar34,pNVar11,(ulong)uVar35,OVar3,AVar4,TVar12);
    infix.size_ = 3;
    infix.data_ = " = ";
    WrapBinary((Value *)__result.container,this,&args,infix,true,Assign);
    break;
  case Unary:
    pOVar16 = cast<wabt::OpcodeExpr<(wabt::ExprType)56>,wabt::Expr>(n->e);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    OpcodeToToken_abi_cxx11_((string *)&local_158,this,(Opcode)(pOVar16->opcode).enum_);
    std::operator+(&decls,(string *)&local_158,"(");
    prefix_02.size_ = decls._M_string_length;
    prefix_02.data_ = decls._M_dataplus._M_p;
    local_a8 = ")";
    uStack_a0 = 1;
    sVar40.size_._0_4_ = 1;
    sVar40.data_ = ")";
    sVar40.size_._4_4_ = 0;
    WrapChild((Value *)__result.container,this,pVVar34,prefix_02,sVar40,Atomic);
LAB_001660e0:
    std::__cxx11::string::_M_dispose();
    goto LAB_001651aa;
  case Last:
    pcVar32 = "unreachable";
LAB_00165bce:
    std::__cxx11::string::string((string *)&decls,pcVar32,(allocator *)&jmp);
    local_158 = (string_view)ZEXT816(0);
    local_148._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
               &decls,local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__result.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_158);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
    goto LAB_0016509e;
  }
LAB_001651af:
  std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::~vector(&args);
  return (Value *)__result.container;
switchD_001651f1_caseD_11:
  pVVar34 = args.
            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
            _M_impl.super__Vector_impl_data._M_start;
  goto LAB_00165d75;
}

Assistant:

Value DecompileExpr(const Node& n, const Node* parent) {
    std::vector<Value> args;
    for (auto& c : n.children) {
      args.push_back(DecompileExpr(c, &n));
    }
    // First deal with the specialized node types.
    switch (n.ntype) {
      case NodeType::FlushToVars: {
        std::string decls = "let ";
        for (Index i = 0; i < n.u.var_count; i++) {
          if (i) decls += ", ";
          decls += TempVarName(n.u.var_start + i);
        }
        decls += " = ";
        return WrapNAry(args, decls, "", Precedence::Assign);
      }
      case NodeType::FlushedVar: {
        return Value { { TempVarName(n.u.var_start) }, Precedence::Atomic };
      }
      case NodeType::Statements: {
        Value stats { {}, Precedence::None };
        for (size_t i = 0; i < n.children.size(); i++) {
          auto& s = args[i].v.back();
          if (s.back() != '}' && s.back() != ':') s += ';';
          std::move(args[i].v.begin(), args[i].v.end(),
                    std::back_inserter(stats.v));
        }
        return stats;
      }
      case NodeType::EndReturn: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case NodeType::Decl: {
        cur_ast->vars_defined[n.u.var->name()].defined = true;
        return Value{
            {"var " + LocalDecl(std::string(n.u.var->name()),
                                cur_func->GetLocalType(*n.u.var))},
            Precedence::None};
      }
      case NodeType::DeclInit: {
        if (cur_ast->vars_defined[n.u.var->name()].defined) {
          // This has already been pre-declared, output as assign.
          return WrapChild(args[0], cat(VarName(n.u.var->name()), " = "), "",
                           Precedence::None);
        } else {
          return WrapChild(
              args[0],
              cat("var ",
                  LocalDecl(std::string(n.u.var->name()),
                            cur_func->GetLocalType(*n.u.var)),
                  " = "),
              "", Precedence::None);
        }
      }
      case NodeType::Expr:
        // We're going to fall thru to the second switch to deal with ExprType.
        break;
      case NodeType::Uninitialized:
        assert(false);
        break;
    }
    // Existing ExprTypes.
    switch (n.etype) {
      case ExprType::Const: {
        auto& c = cast<ConstExpr>(n.e)->const_;
        switch (c.type()) {
          case Type::I32:
            return Value{{std::to_string(static_cast<int32_t>(c.u32()))},
                         Precedence::Atomic};
          case Type::I64:
            return Value{{std::to_string(static_cast<int64_t>(c.u64())) + "L"},
                         Precedence::Atomic};
          case Type::F32: {
            float f = Bitcast<float>(c.f32_bits());
            return Value{{to_string(f) + "f"}, Precedence::Atomic};
          }
          case Type::F64: {
            double d = Bitcast<double>(c.f64_bits());
            return Value{{to_string(d)}, Precedence::Atomic};
          }
          case Type::V128:
            return Value{{"V128"}, Precedence::Atomic};  // FIXME
          default:
            WABT_UNREACHABLE;
        }
      }
      case ExprType::LocalGet: {
        return Get(*cast<LocalGetExpr>(n.e));
      }
      case ExprType::GlobalGet: {
        return Get(*cast<GlobalGetExpr>(n.e));
      }
      case ExprType::LocalSet: {
        return Set(args[0], *cast<LocalSetExpr>(n.e));
      }
      case ExprType::GlobalSet: {
        return Set(args[0], *cast<GlobalSetExpr>(n.e));
      }
      case ExprType::LocalTee: {
        auto& te = *cast<LocalTeeExpr>(n.e);
        return args.empty() ? Get(te) : Set(args[0], te);
      }
      case ExprType::Binary: {
        auto& be = *cast<BinaryExpr>(n.e);
        auto opcs = OpcodeToToken(be.opcode);
        // TODO: Is this selection better done on Opcode values directly?
        // What if new values get added and OtherBin doesn't make sense?
        auto prec = Precedence::OtherBin;
        if (opcs == "*" || opcs == "/" || opcs == "%") {
          prec = Precedence::Multiply;
        } else if (opcs == "+" || opcs == "-") {
          prec = Precedence::Add;
        } else if (opcs == "&" || opcs == "|" || opcs == "^") {
          prec = Precedence::Bit;
        } else if (opcs == "<<" || opcs == ">>") {
          prec = Precedence::Shift;
        }
        return WrapBinary(args, cat(" ", opcs, " "), false, prec);
      }
      case ExprType::Compare: {
        auto& ce = *cast<CompareExpr>(n.e);
         return WrapBinary(args, cat(" ", OpcodeToToken(ce.opcode), " "), false,
                           Precedence::Equal);
      }
      case ExprType::Unary: {
        auto& ue = *cast<UnaryExpr>(n.e);
        //BracketIfNeeded(stack.back());
        // TODO: also version without () depending on precedence.
        return WrapChild(args[0], OpcodeToToken(ue.opcode) + "(", ")",
                         Precedence::Atomic);
      }
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(args[0], n.children[0], le.offset, le.opcode, le.align,
                  le.opcode.GetResultType());
        return std::move(args[0]);
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(args[0], n.children[0], se.offset, se.opcode, se.align,
                  se.opcode.GetParamType2());
        return WrapBinary(args, " = ", true, Precedence::Assign);
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(n.e);
        Value *elsep = nullptr;
        if (!ife->false_.empty()) {
          elsep = &args[2];
        }
        auto& thenp = args[1];
        auto& ifs = args[0];
        bool multiline = ifs.v.size() > 1 || thenp.v.size() > 1;
        size_t width = ifs.width() + thenp.width();
        if (elsep) {
          width += elsep->width();
          multiline = multiline || elsep->v.size() > 1;
        }
        multiline = multiline || width > target_exp_width;
        if (multiline) {
          auto if_start = string_view("if (");
          IndentValue(ifs, if_start.size(), if_start);
          ifs.v.back() += ") {";
          IndentValue(thenp, indent_amount, {});
          std::move(thenp.v.begin(), thenp.v.end(), std::back_inserter(ifs.v));
          if (elsep) {
            ifs.v.push_back("} else {");
            IndentValue(*elsep, indent_amount, {});
            std::move(elsep->v.begin(), elsep->v.end(), std::back_inserter(ifs.v));
          }
          ifs.v.push_back("}");
          ifs.precedence = Precedence::If;
          return std::move(ifs);
        } else {
          auto s = cat("if (", ifs.v[0], ") { ", thenp.v[0], " }");
          if (elsep)
            s += cat(" else { ", elsep->v[0], " }");
          return Value{{std::move(s)}, Precedence::If};
        }
      }
      case ExprType::Block: {
        auto& val = args[0];
        val.v.push_back(
              cat("label ", VarName(cast<BlockExpr>(n.e)->block.label), ":"));
        // If this block is part of a larger statement scope, it doesn't
        // need its own indenting, but if its part of an exp we wrap it in {}.
        if (parent && parent->ntype != NodeType::Statements
                   && parent->etype != ExprType::Block
                   && parent->etype != ExprType::Loop
                   && (parent->etype != ExprType::If ||
                       &parent->children[0] == &n)) {
          IndentValue(val, indent_amount, {});
          val.v.insert(val.v.begin(), "{");
          val.v.push_back("}");
        }
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Loop: {
        auto& val = args[0];
        auto& block = cast<LoopExpr>(n.e)->block;
        IndentValue(val, indent_amount, {});
        val.v.insert(val.v.begin(), cat("loop ", VarName(block.label), " {"));
        val.v.push_back("}");
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Br: {
        auto be = cast<BrExpr>(n.e);
        return Value{{(n.u.lt == LabelType::Loop ? "continue " : "goto ") +
                      VarName(be->var.name())},
                     Precedence::None};
      }
      case ExprType::BrIf: {
        auto bie = cast<BrIfExpr>(n.e);
        auto jmp = n.u.lt == LabelType::Loop ? "continue" : "goto";
        return WrapChild(args[0], "if (", cat(") ", jmp, " ",
                                              VarName(bie->var.name())),
                         Precedence::None);
      }
      case ExprType::Return: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case ExprType::Rethrow: {
        return WrapNAry(args, "rethrow ", "", Precedence::None);
      }
      case ExprType::Drop: {
        // Silent dropping of return values is very common, so currently
        // don't output this.
        return std::move(args[0]);
      }
      case ExprType::Nop: {
        return Value{{"nop"}, Precedence::None};
      }
      case ExprType::Unreachable: {
        return Value{{"unreachable"}, Precedence::None};
      }
      case ExprType::RefNull: {
        return Value{{"null"}, Precedence::Atomic};
      }
      case ExprType::BrTable: {
        auto bte = cast<BrTableExpr>(n.e);
        std::string ts = "br_table[";
        for (auto &v : bte->targets) {
          ts += VarName(v.name());
          ts += ", ";
        }
        ts += "..";
        ts += VarName(bte->default_target.name());
        ts += "](";
        return WrapChild(args[0], ts, ")", Precedence::Atomic);
      }
      default: {
        // Everything that looks like a function call.
        std::string name;
        auto precedence = Precedence::Atomic;
        switch (n.etype) {
          case ExprType::Call:
            name = cast<CallExpr>(n.e)->var.name();
            break;
          case ExprType::ReturnCall:
            name = "return_call " + cast<ReturnCallExpr>(n.e)->var.name();
            precedence = Precedence::None;
            break;
          case ExprType::Convert:
            name = std::string(OpcodeToToken(cast<ConvertExpr>(n.e)->opcode));
            break;
          case ExprType::Ternary:
            name = std::string(OpcodeToToken(cast<TernaryExpr>(n.e)->opcode));
            break;
          case ExprType::Select:
            // This one looks like it could be translated to "?:" style ternary,
            // but the arguments are NOT lazy, and side effects definitely do
            // occur in the branches. So it has no clear equivalent in C-syntax.
            // To emphasize that all args are being evaluated in order, we
            // leave it as a function call.
            name = "select_if";
            break;
          case ExprType::MemoryGrow:
            name = "memory_grow";
            break;
          case ExprType::MemorySize:
            name = "memory_size";
            break;
          case ExprType::MemoryCopy:
            name = "memory_copy";
            break;
          case ExprType::MemoryFill:
            name = "memory_fill";
            break;
          case ExprType::RefIsNull:
            name = "is_null";
            break;
          case ExprType::CallIndirect:
            name = "call_indirect";
            break;
          case ExprType::ReturnCallIndirect:
            name = "return_call call_indirect";
            break;
          default:
            name = GetExprTypeName(n.etype);
            break;
        }
        return WrapNAry(args, name + "(", ")", precedence);
      }
    }
  }